

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O1

void __thiscall Js::SharedContents::Cleanup(SharedContents *this)

{
  int iVar1;
  SharableAgents *buffer;
  IndexToWaitersMap *pIVar2;
  WaiterList *this_00;
  BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  int iVar6;
  ulong uVar7;
  
  if (this->refCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x29,"(refCount == 0)","refCount == 0");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this->buffer = (BYTE *)0x0;
  this->bufferLength = 0;
  CCLock::Enter(&(this->csAgent).super_CCLock);
  buffer = this->allowedAgents;
  if (buffer != (SharableAgents *)0x0) {
    (*(buffer->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
      _vptr_ReadOnlyList[2])(buffer);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,0x30);
    this->allowedAgents = (SharableAgents *)0x0;
  }
  CCLock::Leave(&(this->csAgent).super_CCLock);
  pIVar2 = this->indexToWaiterList;
  if (pIVar2 != (IndexToWaitersMap *)0x0) {
    if (pIVar2->bucketCount != 0) {
      uVar7 = 0;
      do {
        iVar6 = pIVar2->buckets[uVar7];
        while (iVar6 != -1) {
          iVar1 = pIVar2->entries[iVar6].
                  super_DefaultHashedEntry<unsigned_int,_Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_Js::WaiterList_*>.
                  super_ValueEntry<Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>.next;
          this_00 = pIVar2->entries[iVar6].
                    super_DefaultHashedEntry<unsigned_int,_Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_int,_Js::WaiterList_*>.
                    super_ValueEntry<Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>_>
                    .super_KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>.value;
          iVar6 = iVar1;
          if (this_00 != (WaiterList *)0x0) {
            WaiterList::Cleanup(this_00);
            CCLock::~CCLock(&(this_00->csForAccess).super_CCLock);
            Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_00,0x48);
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < pIVar2->bucketCount);
    }
    this_01 = this->indexToWaiterList;
    JsUtil::
    BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary(this_01);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_01,0x38);
    this->indexToWaiterList = (IndexToWaitersMap *)0x0;
  }
  return;
}

Assistant:

void SharedContents::Cleanup()
    {
        Assert(refCount == 0);
        buffer = nullptr;
        bufferLength = 0;
#if DBG
        {
            AutoCriticalSection autoCS(&csAgent);
            if (allowedAgents != nullptr)
            {
                HeapDelete(allowedAgents);
                allowedAgents = nullptr;
            }
        }
#endif

        if (indexToWaiterList != nullptr)
        {
            // TODO: the map should be empty here?
            // or we need to wake all the waiters from current context?
            indexToWaiterList->Map([](uint index, WaiterList *waiters)
            {
                if (waiters != nullptr)
                {
                    waiters->Cleanup();
                    HeapDelete(waiters);
                    waiters = nullptr;
                }
            });

            HeapDelete(indexToWaiterList);
            indexToWaiterList = nullptr;
        }
    }